

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap.c
# Opt level: O0

map_t * remap_init(uint32 n_hashed)

{
  uint uVar1;
  map_t *pmVar2;
  mapping_t *pmVar3;
  uint32 *puVar4;
  uint local_1c;
  uint32 size;
  uint i;
  map_t *new;
  uint32 n_hashed_local;
  
  uVar1 = next_prime(n_hashed * 3);
  pmVar2 = (map_t *)__ckd_calloc__(1,0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                                   ,0x62);
  pmVar3 = (mapping_t *)
           __ckd_calloc__((ulong)uVar1,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,100);
  pmVar2->map = pmVar3;
  puVar4 = (uint32 *)
           __ckd_calloc__((ulong)n_hashed,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,0x65);
  pmVar2->inv = puVar4;
  pmVar2->n_map = uVar1;
  for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
    pmVar2->map[local_1c].x = 0xffffffff;
  }
  return pmVar2;
}

Assistant:

map_t *
remap_init(uint32 n_hashed)
{
    map_t *new;
    unsigned int i;
    uint32 size;

    size = next_prime(n_hashed * 3);

    new = ckd_calloc(1, sizeof(map_t));

    new->map = ckd_calloc(size, sizeof(mapping_t));
    new->inv = ckd_calloc(n_hashed, sizeof(uint32));
    new->n_map = size;

    for (i = 0; i < size; i++) {
	new->map[i].x = FREE_MAPPING;
    }

    return new;
}